

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeckOfCards.cpp
# Opt level: O2

Cards * __thiscall
DeckOfCards::draw(Cards *__return_storage_ptr__,DeckOfCards *this,Cards *pickedCard)

{
  pointer pCVar1;
  bool bVar2;
  pointer pCVar3;
  Cards card;
  int local_b4;
  Cards local_a0;
  
  pCVar3 = (this->deck->super__Vector_base<Cards,_std::allocator<Cards>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pCVar1 = (this->deck->super__Vector_base<Cards,_std::allocator<Cards>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  local_b4 = 0;
  do {
    if (pCVar3 == pCVar1) {
      return __return_storage_ptr__;
    }
    Cards::Cards(&local_a0,pCVar3);
    bVar2 = Cards::operator==(&local_a0,pickedCard);
    if (bVar2) {
      std::vector<Cards,_std::allocator<Cards>_>::erase
                (this->deck,
                 (this->deck->super__Vector_base<Cards,_std::allocator<Cards>_>)._M_impl.
                 super__Vector_impl_data._M_finish + (-1 - (long)local_b4));
      std::vector<Cards,_std::allocator<Cards>_>::push_back(this->discardedDeck,pickedCard);
      Cards::Cards(__return_storage_ptr__,pickedCard);
    }
    else {
      local_b4 = local_b4 + 1;
    }
    Cards::~Cards(&local_a0);
    pCVar3 = pCVar3 + 1;
  } while (!bVar2);
  return __return_storage_ptr__;
}

Assistant:

Cards DeckOfCards::draw(Cards pickedCard) {
    int index=0;
    for(Cards card : *deck){
        if(card == pickedCard){
        deck->erase(deck->end() - 1 - index);
        discardedDeck->push_back(pickedCard);
        return pickedCard;
        }
        else {
            index++;
        }
    }
}